

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void process_arguments(char **arg)

{
  char *pcVar1;
  bool bVar2;
  char **ppcVar3;
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string argument;
  char **local_10;
  char **arg_local;
  
  if (*arg != (char *)0x0) {
    local_10 = arg + 1;
    program_name = *arg;
    while (*local_10 != (char *)0x0) {
      ppcVar3 = local_10 + 1;
      pcVar1 = *local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,pcVar1,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"-h");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"--help"), bVar2)) {
        usage_exit(0);
        local_10 = ppcVar3;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"-t");
        if ((bVar2) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"--trace"), bVar2)) {
          setup_trace_path(*ppcVar3);
          local_10 = local_10 + 2;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"-s");
          if (bVar2) {
            print_stats_on_exit = true;
            local_10 = ppcVar3;
          }
          else {
            std::__cxx11::string::string(local_68,local_30);
            pick_machine((string *)local_68);
            std::__cxx11::string::~string(local_68);
            local_10 = ppcVar3;
          }
        }
      }
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

static void process_arguments(char **arg)
{
    if (*arg == nullptr) return;
    program_name = *arg++;
    while (*arg != nullptr) {
        std::string argument(*arg++);

        if (argument == "-h" or argument == "--help") {
            usage_exit(EXIT_SUCCESS);
        }
        else if (argument == "-t" or argument == "--trace") {
            setup_trace_path(*arg++);
        }
        else if (argument == "-s") {
            print_stats_on_exit = true;
        }
        else {
            pick_machine(argument);
        }
    }
}